

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::shiftUp(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  byte **ppbVar1;
  byte **ppbVar2;
  Node *pNVar3;
  Vector2i VVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  int iVar7;
  undefined4 uVar8;
  long lVar9;
  size_t sVar10;
  
  pNVar3 = this->mKeyVals;
  pNVar3[startIdx].mData.first = pNVar3[startIdx - 1].mData.first;
  pvVar5 = &pNVar3[startIdx - 1].mData;
  iVar7 = (pvVar5->second).advance;
  uVar8 = *(undefined4 *)&(pvVar5->second).field_0xc;
  pvVar6 = &pNVar3[startIdx].mData;
  (pvVar6->second).bearing = (pvVar5->second).bearing;
  (pvVar6->second).advance = iVar7;
  *(undefined4 *)&(pvVar6->second).field_0xc = uVar8;
  ppbVar1 = &pNVar3[startIdx - 1].mData.second.bitmap_data;
  VVar4 = *(Vector2i *)(ppbVar1 + 1);
  ppbVar2 = &pNVar3[startIdx].mData.second.bitmap_data;
  *ppbVar2 = *ppbVar1;
  *(Vector2i *)(ppbVar2 + 1) = VVar4;
  pNVar3[startIdx].mData.second.color_format = pNVar3[startIdx - 1].mData.second.color_format;
  pNVar3[startIdx].mData.second.bitmap_owned_data._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       pNVar3[startIdx - 1].mData.second.bitmap_owned_data._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  pNVar3[startIdx - 1].mData.second.bitmap_owned_data._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  lVar9 = startIdx * 0x38 + -0x70;
  for (sVar10 = startIdx - 1; insertion_idx != sVar10; sVar10 = sVar10 - 1) {
    pair<Rml::Character,_Rml::FontGlyph>::operator=
              ((pair<Rml::Character,_Rml::FontGlyph> *)
               ((long)&this->mKeyVals[1].mData.first + lVar9),
               (pair<Rml::Character,_Rml::FontGlyph> *)
               ((long)&(this->mKeyVals->mData).first + lVar9));
    lVar9 = lVar9 + -0x38;
  }
  for (; insertion_idx != startIdx; startIdx = startIdx - 1) {
    this->mInfo[startIdx] = this->mInfo[startIdx - 1] + (char)this->mInfoInc;
    if (0xff < (uint)this->mInfo[startIdx] + this->mInfoInc) {
      this->mMaxNumElementsAllowed = 0;
    }
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }